

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O3

int Acb_NtkComputePathsR(Acb_Ntk_t *p,Vec_Int_t *vTfi,int fReverse)

{
  char cVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  
  if ((p->vPathR).nSize < 1) {
    uVar2 = (p->vObjType).nCap;
    if ((p->vPathR).nCap < (int)uVar2) {
      piVar6 = (p->vPathR).pArray;
      if (piVar6 == (int *)0x0) {
        piVar6 = (int *)malloc((long)(int)uVar2 << 2);
      }
      else {
        piVar6 = (int *)realloc(piVar6,(long)(int)uVar2 << 2);
      }
      (p->vPathR).pArray = piVar6;
      if (piVar6 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p->vPathR).nCap = uVar2;
    }
    if (0 < (int)uVar2) {
      memset((p->vPathR).pArray,0,(ulong)uVar2 * 4);
    }
    (p->vPathR).nSize = uVar2;
  }
  uVar2 = vTfi->nSize;
  if (fReverse == 0) {
    if (0 < (int)uVar2) {
      lVar9 = 0;
      do {
        iVar5 = vTfi->pArray[lVar9];
        lVar7 = (long)iVar5;
        if (lVar7 < 1) goto LAB_00384bdc;
        if ((p->vObjType).nSize <= iVar5) goto LAB_00384bbd;
        cVar1 = (p->vObjType).pArray[lVar7];
        iVar4 = Acb_ObjSlack(p,iVar5);
        if (cVar1 == '\x04') {
          if ((p->vPathR).nSize <= iVar5) goto LAB_00384c1a;
          (p->vPathR).pArray[lVar7] = (uint)(iVar4 == 0);
        }
        else if (iVar4 == 0) {
          Acb_ObjComputePathR(p,iVar5);
        }
        else {
          if ((p->vPathR).nSize <= iVar5) goto LAB_00384c1a;
          (p->vPathR).pArray[lVar7] = 0;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < vTfi->nSize);
    }
  }
  else {
    uVar8 = (ulong)uVar2;
    if (0 < (int)uVar2) {
      do {
        if ((long)vTfi->nSize < (long)uVar8) goto LAB_00384b9e;
        iVar5 = vTfi->pArray[uVar8 - 1];
        lVar9 = (long)iVar5;
        if (lVar9 < 1) {
LAB_00384bdc:
          __assert_fail("i>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                        ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
        }
        if ((p->vObjType).nSize <= iVar5) {
LAB_00384bbd:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                        ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
        }
        cVar1 = (p->vObjType).pArray[lVar9];
        iVar4 = Acb_ObjSlack(p,iVar5);
        if (cVar1 == '\x04') {
          if ((p->vPathR).nSize <= iVar5) goto LAB_00384c1a;
          (p->vPathR).pArray[lVar9] = (uint)(iVar4 == 0);
        }
        else if (iVar4 == 0) {
          Acb_ObjComputePathR(p,iVar5);
        }
        else {
          if ((p->vPathR).nSize <= iVar5) {
LAB_00384c1a:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          (p->vPathR).pArray[lVar9] = 0;
        }
        bVar3 = 1 < uVar8;
        uVar8 = uVar8 - 1;
      } while (bVar3);
    }
  }
  lVar9 = (long)(p->vCis).nSize;
  if (lVar9 < 1) {
    iVar5 = 0;
  }
  else {
    lVar7 = 0;
    iVar5 = 0;
    do {
      iVar4 = (p->vCis).pArray[lVar7];
      if ((long)iVar4 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                      ,0x116,"int Acb_ObjPathR(Acb_Ntk_t *, int)");
      }
      if ((p->vPathR).nSize <= iVar4) {
LAB_00384b9e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar5 = iVar5 + (p->vPathR).pArray[iVar4];
      lVar7 = lVar7 + 1;
    } while (lVar9 != lVar7);
  }
  p->nPaths = iVar5;
  return iVar5;
}

Assistant:

int Acb_NtkComputePathsR( Acb_Ntk_t * p, Vec_Int_t * vTfi, int fReverse )
{
    int i, iObj, Path = 0;
    if ( !Acb_NtkHasObjPathR( p ) )
        Acb_NtkCleanObjPathR( p );
    // it is assumed that vTfi contains CO nodes
    //assert( Acb_ObjSlack(p, Vec_IntEntry(vTfi, 0)) );
    if ( fReverse )
    {
        Vec_IntForEachEntryReverse( vTfi, iObj, i )
        {
            if ( Acb_ObjIsCo(p, iObj) )
                Acb_ObjSetPathR( p, iObj, Acb_ObjSlack(p, iObj) == 0 );
            else if ( Acb_ObjSlack(p, iObj) )
                Acb_ObjSetPathR( p, iObj, 0 );
            else
                Acb_ObjComputePathR( p, iObj );
        }
    }
    else
    {
        Vec_IntForEachEntry( vTfi, iObj, i )
        {
            if ( Acb_ObjIsCo(p, iObj) )
                Acb_ObjSetPathR( p, iObj, Acb_ObjSlack(p, iObj) == 0 );
            else if ( Acb_ObjSlack(p, iObj) )
                Acb_ObjSetPathR( p, iObj, 0 );
            else
                Acb_ObjComputePathR( p, iObj );
        }
    }
    Acb_NtkForEachCi( p, iObj, i )
        Path += Acb_ObjPathR(p, iObj);
//    assert( p->nPaths == Path );
    p->nPaths = Path;
    return Path;
}